

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O3

void T1_Done_Metrics(FT_Memory memory,AFM_FontInfo fi)

{
  ft_mem_free(memory,fi->KernPairs);
  fi->KernPairs = (AFM_KernPair)0x0;
  fi->NumKernPair = 0;
  ft_mem_free(memory,fi->TrackKerns);
  fi->TrackKerns = (AFM_TrackKern)0x0;
  fi->NumTrackKern = 0;
  ft_mem_free(memory,fi);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Done_Metrics( FT_Memory     memory,
                   AFM_FontInfo  fi )
  {
    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi );
  }